

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_context.cc
# Opt level: O2

pair<const_char_*,_bool> __thiscall
google::protobuf::internal::EpsCopyInputStream::DoneFallback
          (EpsCopyInputStream *this,int overrun,int depth)

{
  LogMessage *pLVar1;
  char *pcVar2;
  int iVar3;
  uint uVar4;
  undefined8 unaff_R12;
  char *pcVar5;
  pair<const_char_*,_bool> pVar6;
  LogFinisher local_69;
  LogMessage local_68;
  
  uVar4 = this->limit_;
  pcVar5 = (char *)CONCAT71((int7)((ulong)unaff_R12 >> 8),1);
  if ((int)uVar4 < overrun) {
    pcVar2 = (char *)0x0;
  }
  else {
    if (uVar4 == overrun) {
      LogMessage::LogMessage
                (&local_68,LOGLEVEL_DFATAL,"third_party/protobuf-lite/parse_context.cc",0xaf);
      pLVar1 = LogMessage::operator<<(&local_68,"CHECK failed: overrun != limit_: ");
      LogFinisher::operator=(&local_69,pLVar1);
      LogMessage::~LogMessage(&local_68);
      uVar4 = this->limit_;
    }
    if ((int)uVar4 <= overrun) {
      LogMessage::LogMessage
                (&local_68,LOGLEVEL_DFATAL,"third_party/protobuf-lite/parse_context.cc",0xb0);
      pLVar1 = LogMessage::operator<<(&local_68,"CHECK failed: overrun < limit_: ");
      LogFinisher::operator=(&local_69,pLVar1);
      LogMessage::~LogMessage(&local_68);
      uVar4 = this->limit_;
    }
    if (this->limit_end_ != this->buffer_end_ + (int)((int)uVar4 >> 0x1f & uVar4)) {
      LogMessage::LogMessage
                (&local_68,LOGLEVEL_DFATAL,"third_party/protobuf-lite/parse_context.cc",0xb5);
      pLVar1 = LogMessage::operator<<
                         (&local_68,
                          "CHECK failed: limit_end_ == buffer_end_ + (std::min)(0, limit_): ");
      LogFinisher::operator=(&local_69,pLVar1);
      LogMessage::~LogMessage(&local_68);
      uVar4 = this->limit_;
    }
    if ((int)uVar4 < 1) {
      LogMessage::LogMessage
                (&local_68,LOGLEVEL_DFATAL,"third_party/protobuf-lite/parse_context.cc",0xb7);
      pLVar1 = LogMessage::operator<<(&local_68,"CHECK failed: limit_ > 0: ");
      LogFinisher::operator=(&local_69,pLVar1);
      LogMessage::~LogMessage(&local_68);
    }
    if (this->limit_end_ != this->buffer_end_) {
      LogMessage::LogMessage
                (&local_68,LOGLEVEL_DFATAL,"third_party/protobuf-lite/parse_context.cc",0xb8);
      pLVar1 = LogMessage::operator<<(&local_68,"CHECK failed: limit_end_ == buffer_end_: ");
      LogFinisher::operator=(&local_69,pLVar1);
      LogMessage::~LogMessage(&local_68);
    }
    do {
      if (overrun < 0) {
        LogMessage::LogMessage
                  (&local_68,LOGLEVEL_DFATAL,"third_party/protobuf-lite/parse_context.cc",0xbc);
        pLVar1 = LogMessage::operator<<(&local_68,"CHECK failed: overrun >= 0: ");
        LogFinisher::operator=(&local_69,pLVar1);
        LogMessage::~LogMessage(&local_68);
      }
      pcVar2 = NextBuffer(this,overrun,depth);
      if (pcVar2 == (char *)0x0) {
        if (overrun == 0) {
          pcVar5 = "ero) == (buffer_[0]): ";
          if (this->limit_ < 1) {
            LogMessage::LogMessage
                      (&local_68,LOGLEVEL_DFATAL,"third_party/protobuf-lite/parse_context.cc",0xc1);
            pLVar1 = LogMessage::operator<<(&local_68,"CHECK failed: limit_ > 0: ");
            LogFinisher::operator=(&local_69,pLVar1);
            LogMessage::~LogMessage(&local_68);
          }
          pcVar2 = this->buffer_end_;
          this->limit_end_ = pcVar2;
          this->last_tag_minus_1_ = 1;
        }
        else {
          pcVar2 = (char *)0x0;
          pcVar5 = "ero) == (buffer_[0]): ";
        }
        goto LAB_001a37a2;
      }
      iVar3 = (int)this->buffer_end_;
      uVar4 = ((int)pcVar2 - iVar3) + this->limit_;
      this->limit_ = uVar4;
      pcVar2 = pcVar2 + overrun;
      overrun = (int)pcVar2 - iVar3;
    } while (-1 < overrun);
    this->limit_end_ = this->buffer_end_ + (int)((int)uVar4 >> 0x1f & uVar4);
    pcVar5 = (char *)0x0;
  }
LAB_001a37a2:
  pVar6._8_8_ = (ulong)pcVar5 & 0xffffffff;
  pVar6.first = pcVar2;
  return pVar6;
}

Assistant:

std::pair<const char*, bool> EpsCopyInputStream::DoneFallback(int overrun,
                                                              int depth) {
  // Did we exceeded the limit (parse error).
  if (PROTOBUF_PREDICT_FALSE(overrun > limit_)) return {nullptr, true};
  GOOGLE_DCHECK(overrun != limit_);  // Guaranteed by caller.
  GOOGLE_DCHECK(overrun < limit_);   // Follows from above
  // TODO(gerbens) Instead of this dcheck we could just assign, and remove
  // updating the limit_end from PopLimit, ie.
  // limit_end_ = buffer_end_ + (std::min)(0, limit_);
  // if (ptr < limit_end_) return {ptr, false};
  GOOGLE_DCHECK(limit_end_ == buffer_end_ + (std::min)(0, limit_));
  // At this point we know the following assertion holds.
  GOOGLE_DCHECK(limit_ > 0);
  GOOGLE_DCHECK(limit_end_ == buffer_end_);  // because limit_ > 0
  const char* p;
  do {
    // We are past the end of buffer_end_, in the slop region.
    GOOGLE_DCHECK(overrun >= 0);
    p = NextBuffer(overrun, depth);
    if (p == nullptr) {
      // We are at the end of the stream
      if (PROTOBUF_PREDICT_FALSE(overrun != 0)) return {nullptr, true};
      GOOGLE_DCHECK(limit_ > 0);
      limit_end_ = buffer_end_;
      // Distinguish ending on a pushed limit or ending on end-of-stream.
      SetEndOfStream();
      return {buffer_end_, true};
    }
    limit_ -= buffer_end_ - p;  // Adjust limit_ relative to new anchor
    p += overrun;
    overrun = p - buffer_end_;
  } while (overrun >= 0);
  limit_end_ = buffer_end_ + std::min(0, limit_);
  return {p, false};
}